

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cxx
# Opt level: O1

ptr<buffer> __thiscall nuraft::snapshot::serialize(snapshot *this)

{
  size_t sVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ulong *in_RSI;
  ptr<buffer> pVar3;
  ptr<buffer> conf_buf;
  buffer *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  cluster_config::serialize((cluster_config *)&stack0xffffffffffffffd8);
  sVar1 = buffer::size(local_28);
  buffer::alloc((buffer *)this,sVar1 + 0x19);
  buffer::put((buffer *)this->last_log_idx_,(byte)in_RSI[5]);
  buffer::put((buffer *)this->last_log_idx_,*in_RSI);
  buffer::put((buffer *)this->last_log_idx_,in_RSI[1]);
  buffer::put((buffer *)this->last_log_idx_,in_RSI[2]);
  buffer::put((buffer *)this->last_log_idx_,local_28);
  buffer::pos((buffer *)this->last_log_idx_,0);
  _Var2._M_pi = extraout_RDX;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> snapshot::serialize() {
    ptr<buffer> conf_buf = last_config_->serialize();
    ptr<buffer> buf = buffer::alloc(conf_buf->size() + sz_ulong * 3 + sz_byte);
    buf->put((byte)type_);
    buf->put(last_log_idx_);
    buf->put(last_log_term_);
    buf->put(size_);
    buf->put(*conf_buf);
    buf->pos(0);
    return buf;
}